

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_impl.c
# Opt level: O0

void gf_25519_sqr(gf_25519_s *cs,gf_25519_s *as)

{
  __uint128_t *__return_storage_ptr__;
  long lVar1;
  undefined1 x [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint64_t in_RDX;
  uint64_t *b;
  uint64_t *b_00;
  long extraout_RDX;
  uint64_t *b_01;
  long extraout_RDX_00;
  long *in_RSI;
  ulong *in_RDI;
  bool bVar5;
  uint64_t a1;
  uint64_t c1;
  uint64_t c0;
  uint64_t ai;
  __uint128_t accum2;
  __uint128_t accum1;
  __uint128_t accum0;
  uint64_t *c;
  uint64_t mask;
  uint64_t *a;
  undefined8 in_stack_fffffffffffffeb8;
  __uint128_t **acc;
  __uint128_t *local_58;
  ulong local_50;
  __uint128_t *local_48;
  uint64_t *local_40;
  __uint128_t *local_38;
  ulong local_30;
  ulong *local_28;
  undefined8 local_20;
  long *local_18;
  
  local_20 = 0x7ffffffffffff;
  __return_storage_ptr__ = (__uint128_t *)*in_RSI;
  local_28 = in_RDI;
  local_18 = in_RSI;
  local_38 = widemul_rr(__return_storage_ptr__,(uint64_t)__return_storage_ptr__,in_RDX);
  local_48 = widemul_rm((__uint128_t *)((long)__return_storage_ptr__ * 2),(uint64_t)(local_18 + 1),b
                       );
  local_40 = b_00;
  local_58 = widemul_rm((__uint128_t *)((long)__return_storage_ptr__ * 2),(uint64_t)(local_18 + 2),
                        b_00);
  uVar3 = local_18[1];
  acc = &local_58;
  local_50 = extraout_RDX;
  mac_rr((__uint128_t *)acc,uVar3,uVar3);
  mac_rm((__uint128_t *)&local_38,uVar3 * 0x26,(uint64_t *)(local_18 + 4));
  lVar1 = local_18[2];
  mac_rm((__uint128_t *)&local_38,lVar1 * 0x26,(uint64_t *)(local_18 + 3));
  mac_rm((__uint128_t *)&local_48,lVar1 * 0x26,(uint64_t *)(local_18 + 4));
  lVar1 = local_18[3];
  mac_rm((__uint128_t *)&local_48,lVar1 * 0x13,(uint64_t *)(local_18 + 3));
  mac_rm((__uint128_t *)acc,lVar1 * 0x26,(uint64_t *)(local_18 + 4));
  uVar2 = (ulong)local_38 & 0x7ffffffffffff;
  x._8_8_ = acc;
  x._0_8_ = in_stack_fffffffffffffeb8;
  uVar3 = shrld((__uint128_t)x,(int)local_38);
  bVar5 = CARRY8((ulong)local_48,uVar3);
  local_48 = (__uint128_t *)((long)local_48 + uVar3);
  local_40 = (uint64_t *)((long)local_40 + (ulong)bVar5);
  uVar4 = (ulong)local_48 & 0x7ffffffffffff;
  x_00._8_8_ = acc;
  x_00._0_8_ = in_stack_fffffffffffffeb8;
  uVar3 = shrld((__uint128_t)x_00,(int)local_48);
  bVar5 = CARRY8((ulong)local_58,uVar3);
  local_58 = (__uint128_t *)((long)local_58 + uVar3);
  local_50 = local_50 + bVar5;
  local_28[2] = (ulong)local_58 & 0x7ffffffffffff;
  local_38 = (__uint128_t *)(local_50 * 0x2000 | (ulong)local_58 >> 0x33);
  local_30 = local_50 >> 0x33;
  lVar1 = *local_18;
  mac_rm((__uint128_t *)&local_38,(uint64_t)(lVar1 * 2),(uint64_t *)(local_18 + 3));
  local_48 = widemul_rm((__uint128_t *)(lVar1 * 2),(uint64_t)(local_18 + 4),b_01);
  lVar1 = local_18[1];
  local_40 = (uint64_t *)extraout_RDX_00;
  mac_rm((__uint128_t *)&local_38,lVar1 * 2,(uint64_t *)(local_18 + 2));
  mac_rm((__uint128_t *)&local_48,lVar1 * 2,(uint64_t *)(local_18 + 3));
  mac_rr((__uint128_t *)&local_38,local_18[4] * 0x13,local_18[4]);
  mac_rr((__uint128_t *)&local_48,local_18[2],local_18[2]);
  local_28[3] = (ulong)local_38 & 0x7ffffffffffff;
  x_01._8_8_ = acc;
  x_01._0_8_ = in_stack_fffffffffffffeb8;
  uVar3 = shrld((__uint128_t)x_01,(int)local_38);
  bVar5 = CARRY8((ulong)local_48,uVar3);
  local_48 = (__uint128_t *)((long)local_48 + uVar3);
  local_40 = (uint64_t *)((long)local_40 + (ulong)bVar5);
  local_28[4] = (ulong)local_48 & 0x7ffffffffffff;
  x_02._8_8_ = acc;
  x_02._0_8_ = in_stack_fffffffffffffeb8;
  uVar3 = shrld((__uint128_t)x_02,(int)local_48);
  uVar2 = uVar3 * 0x13 + uVar2;
  *local_28 = uVar2 & 0x7ffffffffffff;
  local_28[1] = uVar4 + (uVar2 >> 0x33);
  return;
}

Assistant:

void gf_sqr (gf_s *__restrict__ cs, const gf as) {
    const uint64_t *a = as->limb, mask = ((1ull<<51)-1);
    uint64_t *c = cs->limb;
    
    __uint128_t accum0, accum1, accum2;
    
    uint64_t ai = a[0];
    accum0 = widemul_rr(ai, ai);
    ai *= 2;
    accum1 = widemul_rm(ai, &a[1]);
    accum2 = widemul_rm(ai, &a[2]);
    
    ai = a[1];
    mac_rr(&accum2, ai, ai);
    ai *= 38;
    mac_rm(&accum0, ai, &a[4]);
    
    ai = a[2] * 38;
    mac_rm(&accum0, ai, &a[3]);
    mac_rm(&accum1, ai, &a[4]);
    
    ai = a[3] * 19;
    mac_rm(&accum1, ai, &a[3]);
    ai *= 2;
    mac_rm(&accum2, ai, &a[4]);
    
    uint64_t c0 = accum0 & mask;
    accum1 += shrld(accum0, 51);
    uint64_t c1 = accum1 & mask;
    accum2 += shrld(accum1, 51);
    c[2] = accum2 & mask;
    
    accum0 = accum2 >> 51;
    
    ai = a[0]*2;
    mac_rm(&accum0, ai, &a[3]);
    accum1 = widemul_rm(ai, &a[4]);
    
    ai = a[1]*2;
    mac_rm(&accum0, ai, &a[2]);
    mac_rm(&accum1, ai, &a[3]);
    
    mac_rr(&accum0, a[4]*19, a[4]);
    mac_rr(&accum1, a[2], a[2]);
    
    c[3] = accum0 & mask;
    accum1 += shrld(accum0, 51);
    c[4] = accum1 & mask;
    
    /* 2^102 * 16 * 5 * 19 * (1+ep) >> 64
     * = 2^(-13 + <13)
     */
    
    uint64_t a1 = shrld(accum1,51);
    accum1 = a1 * 19 + c0;
    c[0] = accum1 & mask;
    c[1] = c1 + (accum1>>51);
}